

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O0

void __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::TVirtualProtocol(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::SimpleReadTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                   *this,shared_ptr<duckdb_apache::thrift::transport::TTransport> *ptrans)

{
  TProtocolDefaults *in_RSI;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_RDI;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_stack_ffffffffffffffb8;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> *in_stack_ffffffffffffffe8;
  
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::shared_ptr
            (in_RDI,in_stack_ffffffffffffffb8);
  TProtocolDefaults::TProtocolDefaults(in_RSI,in_stack_ffffffffffffffe8);
  std::shared_ptr<duckdb_apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<duckdb_apache::thrift::transport::TTransport> *)0x620742);
  (in_RDI->
  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)&PTR__TVirtualProtocol_00bfe7e0;
  return;
}

Assistant:

TVirtualProtocol(std::shared_ptr<TTransport> ptrans) : Super_(ptrans) {}